

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_catalog_set.cpp
# Opt level: O3

bool __thiscall
duckdb::DependencyCatalogSet::CreateEntry
          (DependencyCatalogSet *this,CatalogTransaction transaction,MangledEntryName *name,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *value)

{
  CatalogSet *this_00;
  bool bVar1;
  MangledDependencyName new_name;
  LogicalDependencyList EMPTY_DEPENDENCIES;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_78;
  string local_70;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_50;
  
  MangledDependencyName::MangledDependencyName
            ((MangledDependencyName *)&local_70,&this->mangled_name,name);
  local_50._M_buckets = &local_50._M_single_bucket;
  local_50._M_bucket_count = 1;
  local_50._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_50._M_element_count = 0;
  local_50._M_rehash_policy._M_max_load_factor = 1.0;
  local_50._M_rehash_policy._M_next_resize = 0;
  local_50._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = this->set;
  local_78._M_head_impl =
       (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>).
       _M_t.super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  (value->super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
  super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl = (CatalogEntry *)0x0;
  bVar1 = CatalogSet::CreateEntry
                    (this_00,transaction,&local_70,
                     (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                      *)&local_78,(LogicalDependencyList *)&local_50);
  if (local_78._M_head_impl != (CatalogEntry *)0x0) {
    (*(local_78._M_head_impl)->_vptr_CatalogEntry[1])();
  }
  local_78._M_head_impl = (CatalogEntry *)0x0;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool DependencyCatalogSet::CreateEntry(CatalogTransaction transaction, const MangledEntryName &name,
                                       unique_ptr<CatalogEntry> value) {
	auto new_name = ApplyPrefix(name);
	const LogicalDependencyList EMPTY_DEPENDENCIES;
	return set.CreateEntry(transaction, new_name.name, std::move(value), EMPTY_DEPENDENCIES);
}